

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O1

XMLAttDefList * __thiscall xercesc_4_0::DTDElementDecl::getAttDefList(DTDElementDecl *this)

{
  DTDAttDefList *this_00;
  
  if (this->fAttList == (DTDAttDefList *)0x0) {
    if (this->fAttDefs == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0)
    {
      faultInAttDefList(this);
    }
    this_00 = (DTDAttDefList *)
              XMemory::operator_new(0x38,(this->super_XMLElementDecl).fMemoryManager);
    DTDAttDefList::DTDAttDefList(this_00,this->fAttDefs,(this->super_XMLElementDecl).fMemoryManager)
    ;
    this->fAttList = this_00;
  }
  return &this->fAttList->super_XMLAttDefList;
}

Assistant:

XMLAttDefList& DTDElementDecl::getAttDefList() const
{
    if (!fAttList)
    {
        // If the att def list is not made yet, then fault it in too
        if (!fAttDefs)
            faultInAttDefList();

        ((DTDElementDecl*)this)->fAttList = new (getMemoryManager()) DTDAttDefList(fAttDefs,getMemoryManager());
    }

    return *fAttList;
}